

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O3

void SpookyHash::Short(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  uint64 uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = *hash1;
  uVar3 = *hash2;
  uVar7 = (uint)length & 0x1f;
  uVar8 = (ulong)uVar7;
  if (length < 0x10) {
    uVar5 = 0xdeadbeefdeadbeef;
  }
  else {
    uVar5 = length >> 3 & 0xfffffffffffffffc;
    if (uVar5 == 0) {
      uVar5 = 0xdeadbeefdeadbeef;
      uVar9 = 0xdeadbeefdeadbeef;
    }
    else {
      puVar1 = (uint *)((long)message + uVar5 * 8);
      uVar9 = 0xdeadbeefdeadbeef;
      uVar5 = 0xdeadbeefdeadbeef;
      do {
        uVar9 = uVar9 + *(long *)((long)message + 8);
        uVar6 = (uVar5 + *message >> 0xe | uVar5 + *message << 0x32) + uVar9;
        uVar5 = uVar4 ^ uVar6;
        uVar10 = (uVar9 >> 0xc | uVar9 << 0x34) + uVar5;
        uVar3 = uVar3 ^ uVar10;
        uVar5 = (uVar5 >> 0x22 | uVar5 << 0x1e) + uVar3;
        uVar6 = uVar6 ^ uVar5;
        uVar3 = (uVar3 >> 0x17 | uVar3 << 0x29) + uVar6;
        uVar10 = uVar10 ^ uVar3;
        uVar9 = (uVar6 >> 10 | uVar6 << 0x36) + uVar10;
        uVar5 = uVar5 ^ uVar9;
        uVar10 = (uVar10 >> 0x10 | uVar10 << 0x30) + uVar5;
        uVar3 = uVar3 ^ uVar10;
        uVar6 = (uVar5 >> 0x1a | uVar5 << 0x26) + uVar3;
        uVar9 = uVar9 ^ uVar6;
        uVar3 = (uVar3 >> 0x1b | uVar3 << 0x25) + uVar9;
        uVar10 = uVar10 ^ uVar3;
        uVar5 = (uVar9 >> 2 | uVar9 << 0x3e) + uVar10;
        uVar6 = uVar6 ^ uVar5;
        uVar9 = (uVar10 >> 0x1e | uVar10 << 0x22) + uVar6;
        uVar3 = uVar3 ^ uVar9;
        uVar6 = (uVar6 >> 0x3b | uVar6 << 5) + uVar3;
        uVar5 = uVar5 ^ uVar6;
        uVar4 = uVar6 + *(long *)((long)message + 0x10);
        uVar3 = (uVar3 >> 0x1c | uVar3 << 0x24) + uVar5;
        uVar9 = uVar9 ^ uVar3;
        uVar3 = uVar3 + *(long *)((long)message + 0x18);
        message = (void *)((long)message + 0x20);
      } while (message < puVar1);
    }
    if (0xf < uVar7) {
      lVar2 = *message;
      uVar9 = uVar9 + *(long *)((long)message + 8);
      message = (void *)((long)message + 0x10);
      uVar8 = uVar8 - 0x10;
      uVar10 = (uVar5 + lVar2 >> 0xe | uVar5 + lVar2 << 0x32) + uVar9;
      uVar6 = uVar4 ^ uVar10;
      uVar5 = (uVar9 >> 0xc | uVar9 << 0x34) + uVar6;
      uVar3 = uVar3 ^ uVar5;
      uVar6 = (uVar6 >> 0x22 | uVar6 << 0x1e) + uVar3;
      uVar10 = uVar10 ^ uVar6;
      uVar3 = (uVar3 >> 0x17 | uVar3 << 0x29) + uVar10;
      uVar5 = uVar5 ^ uVar3;
      uVar10 = (uVar10 >> 10 | uVar10 << 0x36) + uVar5;
      uVar6 = uVar6 ^ uVar10;
      uVar9 = (uVar5 >> 0x10 | uVar5 << 0x30) + uVar6;
      uVar3 = uVar3 ^ uVar9;
      uVar6 = (uVar6 >> 0x1a | uVar6 << 0x26) + uVar3;
      uVar10 = uVar10 ^ uVar6;
      uVar3 = (uVar3 >> 0x1b | uVar3 << 0x25) + uVar10;
      uVar9 = uVar9 ^ uVar3;
      uVar5 = (uVar10 >> 2 | uVar10 << 0x3e) + uVar9;
      uVar6 = uVar6 ^ uVar5;
      uVar3 = (uVar9 >> 0x1e | uVar9 << 0x22) + uVar6 ^ uVar3;
      uVar4 = (uVar6 >> 0x3b | uVar6 << 5) + uVar3;
      uVar5 = uVar5 ^ uVar4;
      uVar3 = (uVar3 >> 0x1c | uVar3 << 0x24) + uVar5;
    }
  }
  uVar9 = length << 0x38;
  switch(uVar8) {
  case 0:
    uVar5 = uVar5 + 0xdeadbeefdeadbeef;
    uVar9 = uVar9 + 0xdeadbeefdeadbeef;
    goto switchD_001799c5_default;
  case 3:
    uVar5 = uVar5 + (ulong)*(byte *)((long)message + 2) * 0x10000;
  case 2:
    uVar5 = uVar5 + (ulong)*(byte *)((long)message + 1) * 0x100;
  case 1:
    uVar8 = (ulong)(byte)*message;
    break;
  case 7:
    uVar5 = uVar5 + ((ulong)*(byte *)((long)message + 6) << 0x30);
  case 6:
    uVar5 = uVar5 + ((ulong)*(byte *)((long)message + 5) << 0x28);
  case 5:
    uVar5 = uVar5 + ((ulong)(byte)*(uint *)((long)message + 4) << 0x20);
  case 4:
    uVar8 = (ulong)*message;
    break;
  case 8:
    goto switchD_001799c5_caseD_8;
  case 0xb:
    uVar9 = uVar9 | (ulong)*(byte *)((long)message + 10) << 0x10;
  case 10:
    uVar9 = uVar9 + (ulong)*(byte *)((long)message + 9) * 0x100;
  case 9:
    uVar8 = (ulong)(byte)*(uint *)((long)message + 8);
    goto LAB_00179a1a;
  case 0xf:
    uVar9 = uVar9 | (ulong)*(byte *)((long)message + 0xe) << 0x30;
  case 0xe:
    uVar9 = uVar9 + ((ulong)*(byte *)((long)message + 0xd) << 0x28);
  case 0xd:
    uVar9 = uVar9 + ((ulong)(byte)*(uint *)((long)message + 0xc) << 0x20);
  case 0xc:
    uVar8 = (ulong)*(uint *)((long)message + 8);
LAB_00179a1a:
    uVar9 = uVar9 + uVar8;
switchD_001799c5_caseD_8:
    uVar5 = uVar5 + *message;
  default:
    goto switchD_001799c5_default;
  }
  uVar5 = uVar5 + uVar8;
switchD_001799c5_default:
  uVar6 = uVar5 >> 0x31 | uVar5 << 0xf;
  uVar8 = (uVar9 ^ uVar5) + uVar6;
  uVar5 = uVar8 >> 0xc | uVar8 << 0x34;
  uVar8 = (uVar4 ^ uVar8) + uVar5;
  uVar10 = uVar8 >> 0x26 | uVar8 * 0x4000000;
  uVar3 = (uVar3 ^ uVar8) + uVar10;
  uVar8 = uVar3 >> 0xd | uVar3 << 0x33;
  uVar3 = (uVar6 ^ uVar3) + uVar8;
  uVar9 = uVar3 >> 0x24 | uVar3 * 0x10000000;
  uVar3 = (uVar5 ^ uVar3) + uVar9;
  uVar5 = uVar3 >> 0x37 | uVar3 * 0x200;
  uVar3 = (uVar10 ^ uVar3) + uVar5;
  uVar6 = uVar3 >> 0x11 | uVar3 << 0x2f;
  uVar3 = (uVar8 ^ uVar3) + uVar6;
  uVar8 = uVar3 >> 10 | uVar3 << 0x36;
  uVar3 = (uVar9 ^ uVar3) + uVar8;
  uVar3 = (uVar3 >> 0x20 | uVar3 << 0x20) + (uVar5 ^ uVar3);
  uVar3 = (uVar3 >> 0x27 | uVar3 * 0x2000000) + (uVar6 ^ uVar3);
  uVar5 = uVar3 >> 1 | uVar3 << 0x3f;
  *hash1 = uVar5;
  *hash2 = (uVar8 ^ uVar3) + uVar5;
  return;
}

Assistant:

void SpookyHash::Short(
    const void *message,
    size_t length,
    uint64 *hash1,
    uint64 *hash2)
{
    uint64 buf[sc_numVars];
    union 
    { 
        const uint8 *p8; 
        uint32 *p32;
        uint64 *p64; 
        size_t i; 
    } u;

    u.p8 = (const uint8 *)message;
    
    if (!ALLOW_UNALIGNED_READS && (u.i & 0x7))
    {
        memcpy(buf, message, length);
        u.p64 = buf;
    }

    size_t remainder = length%32;
    uint64 a=*hash1;
    uint64 b=*hash2;
    uint64 c=sc_const;
    uint64 d=sc_const;

    if (length > 15)
    {
        const uint64 *end = u.p64 + (length/32)*4;
        
        // handle all complete sets of 32 bytes
        for (; u.p64 < end; u.p64 += 4)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            a += u.p64[2];
            b += u.p64[3];
        }
        
        //Handle the case of 16+ remaining bytes.
        if (remainder >= 16)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            u.p64 += 2;
            remainder -= 16;
        }
    }
    
    // Handle the last 0..15 bytes, and its length
    d = ((uint64)length) << 56;
    switch (remainder)
    {
    case 15:
    d += ((uint64)u.p8[14]) << 48;
    case 14:
        d += ((uint64)u.p8[13]) << 40;
    case 13:
        d += ((uint64)u.p8[12]) << 32;
    case 12:
        d += u.p32[2];
        c += u.p64[0];
        break;
    case 11:
        d += ((uint64)u.p8[10]) << 16;
    case 10:
        d += ((uint64)u.p8[9]) << 8;
    case 9:
        d += (uint64)u.p8[8];
    case 8:
        c += u.p64[0];
        break;
    case 7:
        c += ((uint64)u.p8[6]) << 48;
    case 6:
        c += ((uint64)u.p8[5]) << 40;
    case 5:
        c += ((uint64)u.p8[4]) << 32;
    case 4:
        c += u.p32[0];
        break;
    case 3:
        c += ((uint64)u.p8[2]) << 16;
    case 2:
        c += ((uint64)u.p8[1]) << 8;
    case 1:
        c += (uint64)u.p8[0];
        break;
    case 0:
        c += sc_const;
        d += sc_const;
    }
    ShortEnd(a,b,c,d);
    *hash1 = a;
    *hash2 = b;
}